

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,EnumType *type,string_view overrideName)

{
  size_t sVar1;
  EnumType *pEVar2;
  bool bVar3;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_00;
  size_t sVar4;
  char *end;
  Symbol *extraout_RDX;
  Symbol *extraout_RDX_00;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar6;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> this_01;
  char *pcVar7;
  FormatBuffer *pFVar8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_88;
  EnumType *local_68;
  char *local_60;
  size_t local_58;
  string local_50;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> sVar5;
  
  pcVar7 = overrideName._M_str;
  sVar4 = overrideName._M_len;
  if ((this->options).anonymousTypeStyle == FriendlyName) {
    printScope(this,(type->super_IntegralType).super_Type.super_Symbol.parentScope);
    sVar1 = (type->super_IntegralType).super_Type.super_Symbol.name._M_len;
    if (sVar1 == 0) {
      pFVar8 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      if (sVar4 == 0) {
        pcVar7 = "<unnamed enum>";
        end = "";
      }
      else {
        end = pcVar7 + sVar4;
      }
    }
    else {
      pFVar8 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      pcVar7 = (type->super_IntegralType).super_Type.super_Symbol.name._M_str;
      end = pcVar7 + sVar1;
    }
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)pFVar8,pcVar7,end);
    return;
  }
  local_60 = pcVar7;
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"enum","");
  if ((this->options).fullEnumType == true) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl," ","");
    pFVar8 = (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    Type::toString_abi_cxx11_(&local_88,type->baseType);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)pFVar8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(size_t)(local_88.field_2._M_allocated_capacity + 1)
                     );
    }
  }
  local_58 = sVar4;
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"{","");
  local_68 = type;
  sVar9 = Scope::membersOfType<slang::ast::EnumValueSymbol>(&type->super_Scope);
  sVar5 = sVar9._M_end.current;
  if (sVar9._M_begin.current.current != sVar5.current) {
    bVar3 = true;
    do {
      this_01 = sVar9._M_begin.current;
      if (!bVar3) {
        ::fmt::v11::detail::buffer<char>::append<char>
                  ((buffer<char> *)
                   (this->buffer)._M_t.
                   super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                   .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,",","");
      }
      __v = &EnumValueSymbol::getValue((EnumValueSymbol *)this_01.current,(SourceRange)ZEXT816(0))->
             value;
      this_00 = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          (__v);
      pFVar8 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      SVInt::toString_abi_cxx11_(&local_50,this_00,Decimal,true,0xffffff);
      local_88._M_string_length = ((this_01.current)->name)._M_len;
      local_88._M_dataplus._M_p = ((this_01.current)->name)._M_str;
      local_88.field_2._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
      local_88.field_2._8_8_ = local_50._M_string_length;
      fmt.size_ = 5;
      fmt.data_ = "{}={}";
      args.field_1.values_ = (value<fmt::v11::context> *)&local_88;
      args.desc_ = 0xdd;
      ::fmt::v11::detail::vformat_to((buffer<char> *)pFVar8,fmt,args,(locale_ref)0x0);
      sVar6.current = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        sVar6.current = extraout_RDX_00;
      }
      do {
        this_01.current =
             (((EnumValueSymbol *)this_01.current)->super_ValueSymbol).super_Symbol.nextInScope;
        if ((EnumValueSymbol *)this_01.current == (EnumValueSymbol *)0x0) {
          this_01.current = (Symbol *)0x0;
          break;
        }
      } while ((((EnumValueSymbol *)this_01.current)->super_ValueSymbol).super_Symbol.kind !=
               EnumValue);
      sVar9._M_end.current = sVar6.current;
      sVar9._M_begin.current = this_01.current;
      bVar3 = false;
    } while (this_01.current != sVar5.current);
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"}","");
  pEVar2 = local_68;
  if ((this->options).skipScopedTypeNames == false) {
    if (local_58 == 0) {
      printScope(this,(local_68->super_IntegralType).super_Type.super_Symbol.parentScope);
      sVar4 = (pEVar2->super_IntegralType).super_Type.super_Symbol.name._M_len;
      pFVar8 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      if (sVar4 == 0) {
        local_88._M_dataplus._M_p = (pointer)(ulong)(uint)pEVar2->systemId;
        fmt_00.size_ = 4;
        fmt_00.data_ = "e${}";
        args_00.field_1.values_ = (value<fmt::v11::context> *)&local_88;
        args_00.desc_ = 1;
        ::fmt::v11::detail::vformat_to((buffer<char> *)pFVar8,fmt_00,args_00,(locale_ref)0x0);
        return;
      }
      pcVar7 = (pEVar2->super_IntegralType).super_Type.super_Symbol.name._M_str;
    }
    else {
      pFVar8 = (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      sVar4 = local_58;
      pcVar7 = local_60;
    }
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)pFVar8,pcVar7,pcVar7 + sVar4);
  }
  return;
}

Assistant:

void TypePrinter::visit(const EnumType& type, std::string_view overrideName) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        printScope(type.getParentScope());

        if (!type.name.empty())
            buffer->append(type.name);
        else if (overrideName.empty())
            buffer->append("<unnamed enum>");
        else
            buffer->append(overrideName);
    }
    else {
        buffer->append("enum");
        if (options.fullEnumType) {
            buffer->append(" ");
            buffer->append(type.baseType.toString());
        }
        buffer->append("{");

        bool first = true;
        for (const auto& member : type.values()) {
            if (!first)
                buffer->append(",");

            auto& value = member.getValue().integer();
            buffer->format("{}={}", member.name,
                           value.toString(LiteralBase::Decimal, /* includeBase */ true));
            first = false;
        }
        buffer->append("}");

        if (options.skipScopedTypeNames) {
            // Nothing to do here.
        }
        else if (!overrideName.empty()) {
            buffer->append(overrideName);
        }
        else {
            printScope(type.getParentScope());
            if (type.name.empty())
                buffer->format("e${}", type.systemId);
            else
                buffer->append(type.name);
        }
    }
}